

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_tests::LoadReceiveRequests::test_method(LoadReceiveRequests *this)

{
  long lVar1;
  function<void_(std::shared_ptr<wallet::CWallet>)> f;
  function<void_(std::shared_ptr<wallet::CWallet>)> f_00;
  function<void_(std::shared_ptr<wallet::CWallet>)> f_01;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  code *in_stack_ffffffffffffff48;
  code *in_stack_ffffffffffffff50;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  DatabaseFormat format;
  string name;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar2 = 4; lVar2 != 0; lVar2 = lVar2 + -4) {
    format = SQLITE;
    tinyformat::format<wallet::DatabaseFormat>(&name,"receive-requests-%i",&format);
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:465:38)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:465:38)>
               ::_M_manager;
    f.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff40;
    f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff38;
    f.super__Function_base._M_manager = in_stack_ffffffffffffff48;
    f._M_invoker = in_stack_ffffffffffffff50;
    TestLoadWallet(&name,format,f);
    std::_Function_base::~_Function_base((_Function_base *)&local_88);
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_90 = std::
               _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:476:38)>
               ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:476:38)>
               ::_M_manager;
    f_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff40;
    f_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff38;
    f_00.super__Function_base._M_manager = in_stack_ffffffffffffff48;
    f_00._M_invoker = in_stack_ffffffffffffff50;
    TestLoadWallet(&name,format,f_00);
    std::_Function_base::~_Function_base((_Function_base *)&local_a8);
    in_stack_ffffffffffffff38 = (void *)0x0;
    in_stack_ffffffffffffff40 = 0;
    in_stack_ffffffffffffff50 =
         std::
         _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:488:38)>
         ::_M_invoke;
    in_stack_ffffffffffffff48 =
         std::
         _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:488:38)>
         ::_M_manager;
    f_01.super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:488:38)>
         ::_M_manager;
    f_01.super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    f_01._M_invoker =
         std::
         _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:488:38)>
         ::_M_invoke;
    TestLoadWallet(&name,format,f_01);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff38);
    std::__cxx11::string::~string((string *)&name);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(LoadReceiveRequests, TestingSetup)
{
    for (DatabaseFormat format : DATABASE_FORMATS) {
        const std::string name{strprintf("receive-requests-%i", format)};
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            WalletBatch batch{wallet->GetDatabase()};
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), true));
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(ScriptHash(), true));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "0", "val_rr00"));
            BOOST_CHECK(wallet->EraseAddressReceiveRequest(batch, PKHash(), "0"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr10"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr11"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, ScriptHash(), "2", "val_rr20"));
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11", "val_rr20"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
            RunWithinTxn(wallet->GetDatabase(), /*process_desc*/"test", [](WalletBatch& batch){
                BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), false));
                BOOST_CHECK(batch.EraseAddressData(ScriptHash()));
                return true;
            });
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
        });
    }
}